

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O0

void u_init(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int i;
  
  flags.female = (boolean)u.initgend;
  flags.beginner = '\x01';
  u.ustuck = (monst *)0x0;
  u._1052_1_ = u._1052_1_ & 0x7f;
  u.uz.dlevel = '\x01';
  u.uz0.dlevel = '\0';
  u.utolev = u.uz;
  u.umoved = '\0';
  u.umortality = 0;
  u.ugrave_arise = -1;
  if ((flags.female == '\0') || (urole.femalenum == -1)) {
    local_10 = (int)urole.malenum;
  }
  else {
    local_10 = (int)urole.femalenum;
  }
  u.umonster = local_10;
  u.umonnum = local_10;
  init_uasmon();
  u.ulevel = 0;
  u.uhp = newhp();
  u.uenmax = (int)urole.enadv.infix + (int)urace.enadv.infix;
  u.uhpmax = u.uhp;
  if ('\0' < urole.enadv.inrnd) {
    iVar1 = rnd((int)urole.enadv.inrnd);
    u.uenmax = iVar1 + u.uenmax;
  }
  if ('\0' < urace.enadv.inrnd) {
    iVar1 = rnd((int)urace.enadv.inrnd);
    u.uenmax = iVar1 + u.uenmax;
  }
  u.uen = u.uenmax;
  u.uspellprot = '\0';
  adjabil(0,1);
  u.ulevelmax = 1;
  u.ulevel = 1;
  u.roleplay.ascet = flags.ascet;
  u.roleplay.atheist = flags.atheist;
  u.roleplay.blindfolded = flags.blindfolded;
  u.roleplay.illiterate = flags.illiterate;
  u.roleplay.pacifist = flags.pacifist;
  u.roleplay.nudist = flags.nudist;
  u.roleplay.vegan = flags.vegan;
  u.roleplay.vegetarian = flags.vegetarian;
  init_uhunger();
  for (local_c = 0; local_c < 0x2c; local_c = local_c + 1) {
    spl_book[local_c].sp_id = 0;
  }
  u.ublesscnt = 300;
  u.ualign.type = aligns[u.initalign].value;
  u.ualignbase[1] = u.ualign.type;
  u.ualignbase[0] = u.ualign.type;
  u.ulycn = -1;
  u.ubirthday = turntime;
  u.nv_range = 1;
  u.xray_range = -1;
  u.next_attr_check = 600;
  return;
}

Assistant:

void u_init(void)
{
	int i;

	flags.female = u.initgend;
	flags.beginner = 1;
	
	u.ustuck = NULL;
	u.uwilldrown = 0;

	u.uz.dlevel = 1;
	u.uz0.dlevel = 0;
	u.utolev = u.uz;

	u.umoved = FALSE;
	u.umortality = 0;
	u.ugrave_arise = NON_PM;

	u.umonnum = u.umonster = (flags.female &&
			urole.femalenum != NON_PM) ? urole.femalenum :
			urole.malenum;
	init_uasmon();

	u.ulevel = 0;	/* set up some of the initial attributes */
	u.uhp = u.uhpmax = newhp();
	u.uenmax = urole.enadv.infix + urace.enadv.infix;
	if (urole.enadv.inrnd > 0)
	    u.uenmax += rnd(urole.enadv.inrnd);
	if (urace.enadv.inrnd > 0)
	    u.uenmax += rnd(urace.enadv.inrnd);
	u.uen = u.uenmax;
	u.uspellprot = 0;
	adjabil(0,1);
	u.ulevel = u.ulevelmax = 1;

	/*
	 * u.roleplay should be treated similar to gender and alignment
	 *   - it gets set at character creation
	 *   - it's hard to change in-game
	 *     (e.g. a special NPC could teach literacy somewhere)
	 * the initialisation has to be in front of food, alignment
	 * and inventory.
	 */
	u.roleplay.ascet	= flags.ascet;
	u.roleplay.atheist	= flags.atheist;
	u.roleplay.blindfolded	= flags.blindfolded;
	u.roleplay.illiterate	= flags.illiterate;
	u.roleplay.pacifist	= flags.pacifist;
	u.roleplay.nudist	= flags.nudist;
	u.roleplay.vegan	= flags.vegan;
	u.roleplay.vegetarian	= flags.vegetarian;

	init_uhunger();
	for (i = 0; i <= MAXSPELL; i++) spl_book[i].sp_id = NO_SPELL;
	u.ublesscnt = 300;			/* no prayers just yet */
	u.ualignbase[A_CURRENT] = u.ualignbase[A_ORIGINAL] = u.ualign.type =
			aligns[u.initalign].value;
	u.ulycn = NON_PM;

	u.ubirthday = turntime;

	/*
	 *  For now, everyone starts out with a night vision range of 1 and
	 *  their xray range disabled.
	 */
	u.nv_range   =  1;
	u.xray_range = -1;
	u.next_attr_check = 600; /* arbitrary initial setting */
}